

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O0

void __thiscall nvim::Nvim::async_win_del_var(Nvim *this,Window window,string *name)

{
  allocator local_41;
  string local_40;
  string *local_20;
  string *name_local;
  Window window_local;
  Nvim *this_local;
  
  local_20 = name;
  name_local = (string *)window;
  window_local = (Window)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"nvim_win_del_var",&local_41);
  NvimRPC::async_call<long,std::__cxx11::string>
            (&this->client_,&local_40,(long *)&name_local,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

void Nvim::async_win_del_var(Window window, const std::string& name) {
    client_.async_call("nvim_win_del_var", window, name);
}